

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t *
containerptr_roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val,uint8_t *type,int *index)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  shared_container_t *sc;
  container_t *pcVar4;
  array_container_t *c;
  container_t *pcVar5;
  void **ppvVar6;
  ushort key;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint8_t new_type;
  uint8_t local_39;
  uint *local_38;
  
  iVar8 = (r->high_low_container).size;
  key = (ushort)(val >> 0x10);
  local_38 = (uint *)index;
  if (((long)iVar8 == 0) || (puVar2 = (r->high_low_container).keys, puVar2[(long)iVar8 + -1] == key)
     ) {
    uVar7 = iVar8 - 1;
  }
  else {
    if (iVar8 < 1) {
      uVar7 = 0xffffffff;
      goto LAB_0010264e;
    }
    iVar8 = iVar8 + -1;
    uVar9 = 0;
    do {
      uVar7 = iVar8 + uVar9 >> 1;
      uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar8 + uVar9 & 0xfffffffe));
      if (uVar1 < key) {
        uVar9 = uVar7 + 1;
      }
      else {
        if (uVar1 <= key) goto LAB_00102570;
        iVar8 = uVar7 - 1;
      }
    } while ((int)uVar9 <= iVar8);
    uVar7 = ~uVar9;
  }
  if (-1 < (int)uVar7) {
LAB_00102570:
    ppvVar6 = (r->high_low_container).containers;
    puVar3 = (r->high_low_container).typecodes;
    uVar9 = uVar7 & 0xffff;
    sc = (shared_container_t *)ppvVar6[uVar9];
    if (puVar3[uVar9] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar9);
      ppvVar6 = (r->high_low_container).containers;
    }
    *(shared_container_t **)((long)ppvVar6 + (ulong)(uVar9 * 8)) = sc;
    local_39 = (r->high_low_container).typecodes[uVar9];
    *type = local_39;
    pcVar5 = *(container_t **)((long)(r->high_low_container).containers + (ulong)(uVar9 * 8));
    pcVar4 = container_add(pcVar5,(uint16_t)val,local_39,&local_39);
    *local_38 = uVar7;
    if (pcVar4 == pcVar5) {
      return pcVar5;
    }
    container_free(pcVar5,*type);
    (r->high_low_container).containers[uVar7] = pcVar4;
    (r->high_low_container).typecodes[uVar7] = local_39;
    *type = local_39;
    return pcVar4;
  }
LAB_0010264e:
  c = array_container_create();
  pcVar5 = container_add(c,(uint16_t)val,'\x02',type);
  ra_insert_new_key_value_at(&r->high_low_container,~uVar7,key,pcVar5,*type);
  *local_38 = ~uVar7;
  return pcVar5;
}

Assistant:

static inline container_t *containerptr_roaring_bitmap_add(roaring_bitmap_t *r,
                                                           uint32_t val,
                                                           uint8_t *type,
                                                           int *index) {
    roaring_array_t *ra = &r->high_low_container;

    uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    if (i >= 0) {
        ra_unshare_container_at_index(ra, (uint16_t)i);
        container_t *c = ra_get_container_at_index(ra, (uint16_t)i, type);
        uint8_t new_type = *type;
        container_t *c2 = container_add(c, val & 0xFFFF, *type, &new_type);
        *index = i;
        if (c2 != c) {
            container_free(c, *type);
            ra_set_container_at_index(ra, i, c2, new_type);
            *type = new_type;
            return c2;
        } else {
            return c;
        }
    } else {
        array_container_t *new_ac = array_container_create();
        container_t *c =
            container_add(new_ac, val & 0xFFFF, ARRAY_CONTAINER_TYPE, type);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(ra, -i - 1, hb, c, *type);
        *index = -i - 1;
        return c;
    }
}